

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
fd::get_interior_coeffs
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,AccuracyOrder accuracy)

{
  invalid_argument *this;
  initializer_list<double> __l;
  size_type sStack_70;
  double local_68 [9];
  allocator_type local_19;
  
  switch(accuracy) {
  case SECOND:
    local_68[0] = 1.0;
    local_68[1] = -1.0;
    sStack_70 = 2;
    break;
  case FOURTH:
    local_68[2] = 1.0;
    local_68[3] = 2.0;
    local_68[0] = -2.0;
    local_68[1] = -1.0;
    sStack_70 = 4;
    break;
  case SIXTH:
    local_68[4] = 2.0;
    local_68[5] = 3.0;
    local_68[2] = -1.0;
    local_68[3] = 1.0;
    local_68[0] = -3.0;
    local_68[1] = -2.0;
    sStack_70 = 6;
    break;
  case EIGHTH:
    local_68[6] = 3.0;
    local_68[7] = 4.0;
    local_68[4] = 1.0;
    local_68[5] = 2.0;
    local_68[2] = -2.0;
    local_68[3] = -1.0;
    local_68[0] = -4.0;
    local_68[1] = -3.0;
    sStack_70 = 8;
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid accuracy order");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __l._M_array = local_68;
  __l._M_len = sStack_70;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> get_interior_coeffs(const AccuracyOrder accuracy)
{
    switch (accuracy) {
    case SECOND:
        return { { 1, -1 } };
    case FOURTH:
        return { { -2, -1, 1, 2 } };
    case SIXTH:
        return { { -3, -2, -1, 1, 2, 3 } };
    case EIGHTH:
        return { { -4, -3, -2, -1, 1, 2, 3, 4 } };
    default:
        throw std::invalid_argument("invalid accuracy order");
    }
}